

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O2

bool rcg::setFloat(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,double value,
                  bool exception)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  invalid_argument *piVar4;
  allocator local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  double local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [2];
  
  peVar1 = (nodemap->super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_80 = value;
  GenICam_3_4::gcstring::gcstring((gcstring *)local_78,name);
  iVar2 = (*(peVar1->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar1,local_78);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  GenICam_3_4::gcstring::~gcstring((gcstring *)local_78);
  if (plVar3 == (long *)0x0) {
    if (exception) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_a0,"Feature not found: ",&local_a1);
      std::operator+(local_78,&local_a0,name);
      std::invalid_argument::invalid_argument(piVar4,(string *)local_78);
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    iVar2 = (*(code *)**(undefined8 **)((long)plVar3 + *(long *)(*plVar3 + -0x28)))
                      ((long)plVar3 + *(long *)(*plVar3 + -0x28));
    if ((iVar2 == 4) || (iVar2 == 2)) {
      plVar3 = (long *)__dynamic_cast(plVar3,&GenApi_3_4::INode::typeinfo,
                                      &GenApi_3_4::IFloat::typeinfo,0xfffffffffffffffe);
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 0x38))(local_80,plVar3,1);
        return true;
      }
      if (exception) {
        piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)&local_a0,"Feature not float: ",&local_a1);
        std::operator+(local_78,&local_a0,name);
        std::invalid_argument::invalid_argument(piVar4,(string *)local_78);
        __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
    }
    else if (exception) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_a0,"Feature not writable: ",&local_a1);
      std::operator+(local_78,&local_a0,name);
      std::invalid_argument::invalid_argument(piVar4,(string *)local_78);
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return false;
}

Assistant:

bool setFloat(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
              double value, bool exception)
{
  bool ret=false;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsWritable(node))
      {
        GenApi::IFloat *val=dynamic_cast<GenApi::IFloat *>(node);

        if (val != 0)
        {
          val->SetValue(value);
          ret=true;
        }
        else if (exception)
        {
          throw std::invalid_argument(std::string("Feature not float: ")+name);
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not writable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}